

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoEngine.cpp
# Opt level: O1

void __thiscall
VideoEngine::VideoEngine
          (VideoEngine *this,Resources *resources,shared_ptr<renderdesc::Pipeline> *pipeline)

{
  uint uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  pointer pTVar4;
  long lVar5;
  pointer pPVar6;
  pointer psVar7;
  bool bVar8;
  int iVar9;
  PolledTexture *this_00;
  ulong uVar10;
  Program *p;
  pointer pTVar11;
  int *piVar12;
  pointer pPVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  long lVar14;
  Framebuffer fb;
  undefined1 local_78 [64];
  int *local_38;
  
  this->resources_ = resources;
  (this->pipeline_).super___shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pipeline->super___shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (pipeline->super___shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->pipeline_).super___shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_78._32_8_ = &this->textures_;
  local_78._48_8_ = &this->framebuffer_;
  local_78._40_8_ = &this->sources_;
  local_78._56_8_ = &this->programs_;
  (this->programs_).super__Vector_base<PolledShaderProgram,_std::allocator<PolledShaderProgram>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->programs_).super__Vector_base<PolledShaderProgram,_std::allocator<PolledShaderProgram>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sources_).
  super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->programs_).super__Vector_base<PolledShaderProgram,_std::allocator<PolledShaderProgram>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sources_).
  super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sources_).
  super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->framebuffer_).
  super__Vector_base<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->framebuffer_).
  super__Vector_base<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->textures_).
  super__Vector_base<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->framebuffer_).
  super__Vector_base<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->textures_).
  super__Vector_base<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->textures_).
  super__Vector_base<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->canvas_)._M_t.
  super___uniq_ptr_impl<VideoEngine::Canvas,_std::default_delete<VideoEngine::Canvas>_>._M_t.
  super__Tuple_impl<0UL,_VideoEngine::Canvas_*,_std::default_delete<VideoEngine::Canvas>_>.
  super__Head_base<0UL,_VideoEngine::Canvas_*,_false>._M_head_impl = (Canvas *)0x0;
  peVar3 = (pipeline->super___shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pTVar11 = (peVar3->textures).
            super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
            super__Vector_impl_data._M_start;
  pTVar4 = (peVar3->textures).
           super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_78._24_8_ = pipeline;
  if (pTVar11 != pTVar4) {
    do {
      if ((pTVar11->file)._M_string_length == 0) {
        this_00 = (PolledTexture *)operator_new(0x28);
        PolledTexture::PolledTexture(this_00,pTVar11->w,pTVar11->h,pTVar11->pixel_type);
        local_78._0_8_ = this_00;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<PolledTexture*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8),this_00);
        std::vector<std::shared_ptr<PolledTexture>,std::allocator<std::shared_ptr<PolledTexture>>>::
        emplace_back<std::shared_ptr<PolledTexture>>
                  ((vector<std::shared_ptr<PolledTexture>,std::allocator<std::shared_ptr<PolledTexture>>>
                    *)local_78._32_8_,(shared_ptr<PolledTexture> *)local_78);
      }
      else {
        Resources::getTexture((Resources *)local_78,(string *)this->resources_);
        std::vector<std::shared_ptr<PolledTexture>,std::allocator<std::shared_ptr<PolledTexture>>>::
        emplace_back<std::shared_ptr<PolledTexture>>
                  ((vector<std::shared_ptr<PolledTexture>,std::allocator<std::shared_ptr<PolledTexture>>>
                    *)local_78._32_8_,(shared_ptr<PolledTexture> *)local_78);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      }
      pTVar11 = pTVar11 + 1;
    } while (pTVar11 != pTVar4);
  }
  piVar12 = *(int **)(*(long *)local_78._24_8_ + 0x18);
  local_38 = *(int **)(*(long *)local_78._24_8_ + 0x20);
  if (piVar12 != local_38) {
    do {
      local_78._0_8_ = (PolledTexture *)0x0;
      local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      glGenFramebuffers(1,local_78 + 0xc);
      glBindFramebuffer(0x8d40,local_78._12_4_);
      GLCHECK("glBindFramebuffer(GL_FRAMEBUFFER, fb.name)");
      iVar9 = *piVar12;
      if (0 < iVar9) {
        uVar10 = 0;
        do {
          uVar1 = piVar12[uVar10 + 1];
          if (((long)(int)uVar1 < 0) ||
             ((int)((ulong)((long)(this->textures_).
                                  super__Vector_base<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->textures_).
                                 super__Vector_base<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) <= (int)uVar1)) {
            aAppDebugPrintf("[CRASH] Fb texture %d OOB %d (max %d)",uVar10 & 0xffffffff,(ulong)uVar1
                            ,(ulong)((long)(this->textures_).
                                           super__Vector_base<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->textures_).
                                          super__Vector_base<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4);
            aAppTerminate(-1);
          }
          bVar8 = Framebuffer::attachColorTexture
                            ((Framebuffer *)local_78,(int)uVar10,
                             &(((_Vector_impl_data *)
                               &(((path *)local_78._32_8_)->_M_pathname)._M_dataplus)->_M_start
                               [(int)uVar1].
                               super___shared_ptr<PolledTexture,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ->texture_);
          if (!bVar8) {
            aAppDebugPrintf("[CRASH] Framebuffer %d is not complete",
                            (ulong)((long)(this->framebuffer_).
                                          super__Vector_base<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->framebuffer_).
                                         super__Vector_base<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4);
            aAppTerminate(-1);
          }
          uVar10 = uVar10 + 1;
          iVar9 = *piVar12;
        } while ((long)uVar10 < (long)iVar9);
      }
      local_78._8_4_ = iVar9;
      std::vector<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>::
      emplace_back<VideoEngine::Framebuffer>
                ((vector<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_> *)
                 local_78._48_8_,(Framebuffer *)local_78);
      glDeleteFramebuffers(1,local_78 + 0xc);
      piVar12 = piVar12 + 5;
    } while (piVar12 != local_38);
  }
  glBindFramebuffer(0x8d40,0);
  GLCHECK("glBindFramebuffer(GL_FRAMEBUFFER, 0)");
  lVar5 = *(long *)(*(long *)local_78._24_8_ + 0x38);
  for (lVar14 = *(long *)(*(long *)local_78._24_8_ + 0x30); lVar14 != lVar5; lVar14 = lVar14 + 0x20)
  {
    Resources::getShaderSource((Resources *)local_78,(string *)this->resources_);
    std::
    vector<std::shared_ptr<PolledShaderSource>,std::allocator<std::shared_ptr<PolledShaderSource>>>
    ::emplace_back<std::shared_ptr<PolledShaderSource>>
              ((vector<std::shared_ptr<PolledShaderSource>,std::allocator<std::shared_ptr<PolledShaderSource>>>
                *)local_78._40_8_,(shared_ptr<PolledShaderSource> *)local_78);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
  }
  peVar3 = (((shared_ptr<renderdesc::Pipeline> *)local_78._24_8_)->
           super___shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pPVar6 = *(pointer *)
            ((long)&(peVar3->programs).
                    super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>.
                    _M_impl.super__Vector_impl_data + 8);
  for (pPVar13 = (peVar3->programs).
                 super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>.
                 _M_impl.super__Vector_impl_data._M_start; pPVar13 != pPVar6; pPVar13 = pPVar13 + 1)
  {
    uVar1 = pPVar13->vertex;
    if (((int)uVar1 < 0) ||
       ((int)((ulong)((long)(this->sources_).
                            super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->sources_).
                           super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) <= (int)uVar1)) {
      aAppDebugPrintf("[CRASH] Program vertex source OOB %d (max %d)",(ulong)uVar1,
                      (ulong)((long)(this->sources_).
                                    super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->sources_).
                                   super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
      aAppTerminate(-1);
    }
    uVar1 = pPVar13->fragment;
    if (((int)uVar1 < 0) ||
       ((int)((ulong)((long)(this->sources_).
                            super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->sources_).
                           super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) <= (int)uVar1)) {
      aAppDebugPrintf("[CRASH] Program fragment source OOB %d (max %d)",(ulong)uVar1,
                      (ulong)((long)(this->sources_).
                                    super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->sources_).
                                   super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
      aAppTerminate(-1);
    }
    psVar7 = ((_Vector_impl_data *)&(((path *)local_78._40_8_)->_M_pathname)._M_dataplus)->_M_start;
    std::vector<PolledShaderProgram,std::allocator<PolledShaderProgram>>::
    emplace_back<Expected<std::__cxx11::string,std::__cxx11::string>(&)(shader::Source_const&),std::shared_ptr<PolledShaderSource>&,std::shared_ptr<PolledShaderSource>&>
              ((vector<PolledShaderProgram,std::allocator<PolledShaderProgram>> *)local_78._56_8_,
               shaderPreprocessor_abi_cxx11_,psVar7 + pPVar13->vertex,psVar7 + pPVar13->fragment);
  }
  return;
}

Assistant:

VideoEngine::VideoEngine(Resources &resources, const std::shared_ptr<renderdesc::Pipeline> &pipeline)
	: resources_(resources)
	, pipeline_(pipeline)
{
	for (const auto& t: pipeline->textures) {
		if (t.file.empty()) {
			textures_.emplace_back(std::shared_ptr<PolledTexture>(new PolledTexture(t.w, t.h, t.pixel_type)));
		} else {
			textures_.emplace_back(resources_.getTexture(t.file));
		}
	}

	for (const auto& f: pipeline->framebuffers) {
		Framebuffer fb;
		GL(glBindFramebuffer(GL_FRAMEBUFFER, fb.name));
		for (int i = 0; i < f.textures_count; ++i) {
			const int index = f.textures[i];
			if (index < 0 || index >= (int)textures_.size())
				CRASH("Fb texture %d OOB %d (max %d)", i, index, (int)textures_.size());

			if (!fb.attachColorTexture(i, textures_[index]->texture()))
				CRASH("Framebuffer %d is not complete", (int)framebuffer_.size());
		}

		fb.num_targets = f.textures_count;

		framebuffer_.push_back(std::move(fb));
	}

	GL(glBindFramebuffer(GL_FRAMEBUFFER, 0));

	for (const auto& s: pipeline->shader_filenames)
		sources_.emplace_back(resources_.getShaderSource(s));

	for (const auto& p: pipeline->programs) {
		if (p.vertex < 0 || p.vertex >= (int)sources_.size())
			CRASH("Program vertex source OOB %d (max %d)", p.vertex, (int)sources_.size());
		if (p.fragment < 0 || p.fragment >= (int)sources_.size())
			CRASH("Program fragment source OOB %d (max %d)", p.fragment, (int)sources_.size());

		programs_.emplace_back(shaderPreprocessor, sources_[p.vertex], sources_[p.fragment]);
	}
}